

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int str_utf8_is_whitespace(int code)

{
  int code_local;
  undefined4 local_4;
  
  if (((((((code < 0x21) || (code == 0xa0)) || (code == 0x34f)) ||
        (((0x1fff < code && (code < 0x2010)) || ((0x2027 < code && (code < 0x2030)))))) ||
       ((0x205e < code && (code < 0x2065)))) || ((0x2069 < code && (code < 0x2070)))) ||
     ((code == 0x3000 ||
      ((((0xfdff < code && (code < 0xfe10)) || (code == 0xfeff)) ||
       ((0xfff8 < code && (code < 0xfffd)))))))) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int str_utf8_is_whitespace(int code)
{
	// check if unicode is not empty
	if(code > 0x20 && code != 0xA0 && code != 0x034F && (code < 0x2000 || code > 0x200F) && (code < 0x2028 || code > 0x202F) &&
		(code < 0x205F || code > 0x2064) && (code < 0x206A || code > 0x206F) && code != 0x3000  && (code < 0xFE00 || code > 0xFE0F) &&
		code != 0xFEFF && (code < 0xFFF9 || code > 0xFFFC))
	{
		return 0;
	}
	return 1;
}